

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_control-test.cpp
# Opt level: O2

void print_button(char *name,bool state)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  char *pcVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,name);
  poVar1 = std::operator<<(poVar1," ");
  pcVar2 = "released";
  if ((int)CONCAT71(in_register_00000031,state) != 0) {
    pcVar2 = "pressed";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void print_button(const char *name, bool state)
{
  cout << name << " " << (state ? "pressed" : "released") << endl;
}